

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::ssc::SscWriterNaive::PutDeferred
          (SscWriterNaive *this,VariableBase *variable,void *data)

{
  size_t sVar1;
  unsigned_long uVar2;
  pointer pBVar3;
  size_t __n;
  unsigned_long *puVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  unsigned_long *puVar8;
  size_t sVar9;
  pointer puVar10;
  BlockInfo *b;
  pointer pBVar11;
  Dims vShape;
  Dims vCount;
  Dims vStart;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (*(int *)(variable + 0x28) == 0xe) {
    std::
    vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
    ::emplace_back<>(&this->m_Metadata);
    pBVar11 = (this->m_Metadata).
              super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_assign((string *)(pBVar11 + -1));
    pBVar11[-1].type = String;
    pBVar11[-1].shapeId = *(ShapeID *)(variable + 0x40);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pBVar11[-1].shape,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pBVar11[-1].start,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pBVar11[-1].count,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
    sVar9 = (this->super_SscWriterBase).m_Buffer.m_Size;
    pBVar11[-1].bufferStart = sVar9;
    sVar1 = *(size_t *)((long)data + 8);
    pBVar11[-1].bufferCount = sVar1;
    Buffer::resize(&(this->super_SscWriterBase).m_Buffer,sVar1 + sVar9);
    memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + pBVar11[-1].bufferStart,*data,
           *(size_t *)((long)data + 8));
    std::vector<char,_std::allocator<char>_>::resize
              (&pBVar11[-1].value,*(size_type *)((long)data + 8));
    memcpy(pBVar11[-1].value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,*data,*(size_t *)((long)data + 8));
    return;
  }
  if (((*(int *)(variable + 0x40) == 4) || (*(int *)(variable + 0x40) == 1)) &&
     ((this->super_SscWriterBase).m_WriterRank != 0)) {
    return;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x70));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_80,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x88));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_98,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(variable + 0x58));
  if (*(int *)((this->super_SscWriterBase).m_IO + 0x58) != 0) {
    puVar10 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    puVar4 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar10 &&
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar8 = puVar4 + 1;
        uVar2 = *puVar4;
        *puVar4 = *puVar10;
        *puVar10 = uVar2;
        puVar10 = puVar10 + -1;
        puVar4 = puVar8;
      } while (puVar8 < puVar10);
    }
    puVar10 = local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    puVar4 = local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar10 &&
        local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar8 = puVar4 + 1;
        uVar2 = *puVar4;
        *puVar4 = *puVar10;
        *puVar10 = uVar2;
        puVar10 = puVar10 + -1;
        puVar4 = puVar8;
      } while (puVar8 < puVar10);
    }
    puVar10 = local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    puVar4 = local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < puVar10 &&
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        puVar8 = puVar4 + 1;
        uVar2 = *puVar4;
        *puVar4 = *puVar10;
        *puVar10 = uVar2;
        puVar10 = puVar10 + -1;
        puVar4 = puVar8;
      } while (puVar8 < puVar10);
    }
  }
  pBVar11 = (this->m_Metadata).
            super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (this->m_Metadata).
           super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar11 != pBVar3) {
    bVar6 = false;
    do {
      __n = (pBVar11->name)._M_string_length;
      if ((((__n == *(size_t *)(variable + 0x10)) &&
           ((__n == 0 ||
            (iVar7 = bcmp((pBVar11->name)._M_dataplus._M_p,*(void **)(variable + 8),__n), iVar7 == 0
            )))) && (bVar5 = AreSameDims(&local_68,&pBVar11->start), bVar5)) &&
         ((bVar5 = AreSameDims(&local_80,&pBVar11->count), bVar5 &&
          (bVar5 = AreSameDims(&local_98,&pBVar11->shape), bVar5)))) {
        memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + pBVar11->bufferStart,data,
               pBVar11->bufferCount);
        bVar6 = true;
      }
      pBVar11 = pBVar11 + 1;
    } while (pBVar11 != pBVar3);
    if (bVar6) goto LAB_00140fac;
  }
  std::
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  ::emplace_back<>(&this->m_Metadata);
  pBVar11 = (this->m_Metadata).
            super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)(pBVar11 + -1));
  pBVar11[-1].type = *(DataType *)(variable + 0x28);
  pBVar11[-1].shapeId = *(ShapeID *)(variable + 0x40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pBVar11[-1].shape,&local_98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pBVar11[-1].start,&local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&pBVar11[-1].count,&local_80);
  sVar9 = *(size_t *)(variable + 0x30);
  pBVar11[-1].elementSize = sVar9;
  pBVar11[-1].bufferStart = (this->super_SscWriterBase).m_Buffer.m_Size;
  sVar9 = TotalDataSize(&pBVar11[-1].count,sVar9,&pBVar11[-1].shapeId);
  pBVar11[-1].bufferCount = sVar9;
  Buffer::resize(&(this->super_SscWriterBase).m_Buffer,sVar9 + pBVar11[-1].bufferStart);
  memcpy((this->super_SscWriterBase).m_Buffer.m_Buffer + pBVar11[-1].bufferStart,data,
         pBVar11[-1].bufferCount);
  if ((pBVar11[-1].shapeId == LocalValue) || (pBVar11[-1].shapeId == GlobalValue)) {
    std::vector<char,_std::allocator<char>_>::resize
              (&pBVar11[-1].value,*(size_type *)(variable + 0x30));
    memcpy(pBVar11[-1].value.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,data,pBVar11[-1].bufferCount);
  }
  if (*(int *)(variable + 0x28) == 0x10) {
    adios2::core::StructDefinition::StructName_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&pBVar11[-1].structDef,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
LAB_00140fac:
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SscWriterNaive::PutDeferred(VariableBase &variable, const void *data)
{

    if (variable.m_Type == DataType::String)
    {
        const auto dataString = reinterpret_cast<const std::string *>(data);
        m_Metadata.emplace_back();
        auto &b = m_Metadata.back();
        b.name = variable.m_Name;
        b.type = DataType::String;
        b.shapeId = variable.m_ShapeID;
        b.shape = variable.m_Shape;
        b.start = variable.m_Start;
        b.count = variable.m_Count;
        b.bufferStart = m_Buffer.size();
        b.bufferCount = dataString->size();
        m_Buffer.resize(b.bufferStart + b.bufferCount);
        std::memcpy(m_Buffer.data() + b.bufferStart, dataString->data(), dataString->size());
        b.value.resize(dataString->size());
        std::memcpy(b.value.data(), dataString->data(), dataString->size());
        return;
    }

    if ((variable.m_ShapeID == ShapeID::GlobalValue || variable.m_ShapeID == ShapeID::LocalValue ||
         variable.m_Type == DataType::String) &&
        m_WriterRank != 0)
    {
        return;
    }

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
    }

    bool found = false;
    for (const auto &b : m_Metadata)
    {
        if (b.name == variable.m_Name && ssc::AreSameDims(vStart, b.start) &&
            ssc::AreSameDims(vCount, b.count) && ssc::AreSameDims(vShape, b.shape))
        {
            std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
            found = true;
        }
    }

    if (!found)
    {
        m_Metadata.emplace_back();
        auto &b = m_Metadata.back();
        b.name = variable.m_Name;
        b.type = variable.m_Type;
        b.shapeId = variable.m_ShapeID;
        b.shape = vShape;
        b.start = vStart;
        b.count = vCount;
        b.elementSize = variable.m_ElementSize;
        b.bufferStart = m_Buffer.size();
        b.bufferCount = ssc::TotalDataSize(b.count, b.elementSize, b.shapeId);
        m_Buffer.resize(b.bufferStart + b.bufferCount);
        std::memcpy(m_Buffer.data() + b.bufferStart, data, b.bufferCount);
        if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
        {
            b.value.resize(variable.m_ElementSize);
            std::memcpy(b.value.data(), data, b.bufferCount);
        }
        if (variable.m_Type == DataType::Struct)
        {
            b.structDef = reinterpret_cast<VariableStruct *>(&variable)
                              ->m_WriteStructDefinition->StructName();
        }
    }
}